

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SelectionSet::firstOnBit
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,SelectionSet *this)

{
  pointer pOVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  lVar4 = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  piVar3 = (int *)operator_new(0x18);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = piVar3;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = piVar3;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar3 + 6;
  piVar3[0] = 0;
  piVar3[1] = 0;
  piVar3[2] = 0;
  piVar3[3] = 0;
  piVar3[4] = 0;
  piVar3[5] = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = piVar3 + 6;
  do {
    pOVar1 = (this->bitsets_).
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
    iVar2 = 0;
    if ((**(byte **)((long)&(pOVar1->bitset_).super__Bvector_base<std::allocator<bool>_> + lVar4) &
        1) == 0) {
      iVar2 = OpenMDBitSet::nextOnBit
                        ((OpenMDBitSet *)
                         ((long)&(pOVar1->bitset_).super__Bvector_base<std::allocator<bool>_> +
                         lVar4),0);
    }
    *piVar3 = iVar2;
    lVar4 = lVar4 + 0x28;
    piVar3 = piVar3 + 1;
  } while (lVar4 != 0xf0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> SelectionSet::firstOnBit() const {
    std::vector<int> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].firstOnBit();
    return result;
  }